

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBinaryMultiType
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,EBinaryMathOpCodes op)

{
  EmitExpressionInfo EVar1;
  bool bVar2;
  Which WVar3;
  ParseNode *pnode_00;
  ParseNode *pnode_01;
  char16 *pcVar4;
  char16 *pcVar5;
  AsmJsCompilationException *pAVar6;
  bool local_a9;
  AsmJsType local_8c;
  RegSlot local_88;
  RegSlot local_84;
  RegSlot floatReg;
  RegSlot dbReg;
  uint local_78;
  RegSlot intReg;
  EBinaryMathOpCodesTypes opType;
  AsmJsType local_64;
  AsmJsType local_60;
  AsmJsType local_5c;
  AsmJsType *local_58;
  AsmJsType *rType;
  AsmJsType *lType;
  EmitExpressionInfo rhsEmit;
  EmitExpressionInfo lhsEmit;
  ParseNode *rhs;
  ParseNode *lhs;
  EBinaryMathOpCodes op_local;
  ParseNode *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo emitInfo;
  
  pnode_00 = ParserWrapper::GetBinaryLeft(pnode);
  pnode_01 = ParserWrapper::GetBinaryRight(pnode);
  rhsEmit = Emit(this,pnode_00);
  lType = (AsmJsType *)Emit(this,pnode_01);
  rType = &rhsEmit.type;
  local_58 = (AsmJsType *)((long)&lType + 4);
  if ((op == BMO_ADD) || (op == BMO_SUB)) {
    WVar3 = AsmJsType::GetWhich(rType);
    if ((WVar3 == Intish) && ((pnode_00->nop == knopAdd || (pnode_00->nop == knopSub)))) {
      AsmJsType::AsmJsType(&local_5c,Int);
      rType->which_ = (Which)local_5c;
    }
    WVar3 = AsmJsType::GetWhich(local_58);
    if ((WVar3 == Intish) && ((pnode_01->nop == knopAdd || (pnode_01->nop == knopSub)))) {
      AsmJsType::AsmJsType(&local_60,Int);
      local_58->which_ = local_60.which_;
    }
  }
  AsmJsType::AsmJsType(&local_64,Double);
  EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,&local_64);
  StartStatement(this,pnode);
  bVar2 = AsmJsType::isInt(rType);
  if ((bVar2) && (bVar2 = AsmJsType::isInt(local_58), bVar2)) {
    bVar2 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&rhsEmit);
    if (!bVar2) {
      pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar6,L"Invalid Node location[%d] ",(ulong)rhsEmit & 0xffffffff);
      __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
    }
    bVar2 = AsmJsFunc::IsValidLocation<int>(this->mFunction,(EmitExpressionInfo *)&lType);
    if (!bVar2) {
      pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar6,L"Invalid Node location[%d] ",(ulong)lType & 0xffffffff);
      __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
    }
    bVar2 = AsmJsType::isSigned(rType);
    local_a9 = false;
    if (bVar2) {
      local_a9 = AsmJsType::isSigned(local_58);
    }
    local_78 = (uint)(local_a9 == false);
    if ((((op == BMO_REM) || (op == BMO_DIV)) &&
        ((bVar2 = AsmJsType::isSigned(rType), !bVar2 ||
         (bVar2 = AsmJsType::isSigned(local_58), !bVar2)))) &&
       ((bVar2 = AsmJsType::isUnsigned(rType), !bVar2 ||
        (bVar2 = AsmJsType::isUnsigned(local_58), !bVar2)))) {
      pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      pcVar4 = AsmJsType::toChars(rType);
      pcVar5 = AsmJsType::toChars(local_58);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar6,
                 L"arguments to / or %% must both be double?, float?, signed, or unsigned; %s and %s given"
                 ,pcVar4,pcVar5);
      __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
    }
    dbReg = GetAndReleaseBinaryLocations<int>(this,&rhsEmit,(EmitExpressionInfo *)&lType);
    AsmJsByteCodeWriter::AsmReg3
              (&this->mWriter,
               *(OpCodeAsmJs *)(BinaryMathOpCodes + (long)(int)local_78 * 2 + (long)(int)op * 8),
               dbReg,rhsEmit.super_EmitInfoBase.location,(RegSlot)lType);
    this_local._0_4_ = dbReg;
    AsmJsType::AsmJsType((AsmJsType *)&floatReg,Intish);
    this_local._4_4_ = floatReg;
  }
  else {
    bVar2 = AsmJsType::isMaybeDouble(rType);
    if ((bVar2) && (bVar2 = AsmJsType::isMaybeDouble(local_58), bVar2)) {
      bVar2 = AsmJsFunc::IsValidLocation<double>(this->mFunction,&rhsEmit);
      if (!bVar2) {
        pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar6,L"Invalid Node location[%d] ",(ulong)rhsEmit & 0xffffffff);
        __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
      }
      bVar2 = AsmJsFunc::IsValidLocation<double>(this->mFunction,(EmitExpressionInfo *)&lType);
      if (!bVar2) {
        pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar6,L"Invalid Node location[%d] ",(ulong)lType & 0xffffffff);
        __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
      }
      local_84 = GetAndReleaseBinaryLocations<double>(this,&rhsEmit,(EmitExpressionInfo *)&lType);
      AsmJsByteCodeWriter::AsmReg3
                (&this->mWriter,*(OpCodeAsmJs *)(BinaryMathOpCodes + (long)(int)op * 8 + 6),local_84
                 ,rhsEmit.super_EmitInfoBase.location,(RegSlot)lType);
      this_local._0_4_ = local_84;
    }
    else {
      bVar2 = AsmJsType::isMaybeFloat(rType);
      if ((!bVar2) || (bVar2 = AsmJsType::isMaybeFloat(local_58), !bVar2)) {
        pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException(pAVar6,L"Unsupported math operation");
        __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
      }
      if (*(short *)(BinaryMathOpCodes + (long)(int)op * 8 + 4) == 6) {
        pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar6,L"invalid Binary float operation");
        __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
      }
      bVar2 = AsmJsFunc::IsValidLocation<float>(this->mFunction,&rhsEmit);
      if (!bVar2) {
        pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar6,L"Invalid Node location[%d] ",(ulong)rhsEmit & 0xffffffff);
        __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
      }
      bVar2 = AsmJsFunc::IsValidLocation<float>(this->mFunction,(EmitExpressionInfo *)&lType);
      if (!bVar2) {
        pAVar6 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar6,L"Invalid Node location[%d] ",(ulong)lType & 0xffffffff);
        __cxa_throw(pAVar6,&AsmJsCompilationException::typeinfo,0);
      }
      local_88 = GetAndReleaseBinaryLocations<float>(this,&rhsEmit,(EmitExpressionInfo *)&lType);
      AsmJsByteCodeWriter::AsmReg3
                (&this->mWriter,*(OpCodeAsmJs *)(BinaryMathOpCodes + (long)(int)op * 8 + 4),local_88
                 ,rhsEmit.super_EmitInfoBase.location,(RegSlot)lType);
      this_local._0_4_ = local_88;
      AsmJsType::AsmJsType(&local_8c,Floatish);
      this_local._4_4_ = local_8c.which_;
    }
  }
  EndStatement(this,pnode);
  EVar1.type.which_ = this_local._4_4_;
  EVar1.super_EmitInfoBase.location = this_local._0_4_;
  return EVar1;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBinaryMultiType( ParseNode * pnode, EBinaryMathOpCodes op )
    {
        ParseNode* lhs = ParserWrapper::GetBinaryLeft(pnode);
        ParseNode* rhs = ParserWrapper::GetBinaryRight(pnode);

        EmitExpressionInfo lhsEmit = Emit( lhs );
        EmitExpressionInfo rhsEmit = Emit( rhs );
        AsmJsType& lType = lhsEmit.type;
        AsmJsType& rType = rhsEmit.type;

        // don't need coercion inside an a+b+c type expression
        if (op == BMO_ADD || op == BMO_SUB)
        {
            if (lType.GetWhich() == AsmJsType::Intish && (lhs->nop == knopAdd || lhs->nop == knopSub))
            {
                lType = AsmJsType::Int;
            }
            if (rType.GetWhich() == AsmJsType::Intish && (rhs->nop == knopAdd || rhs->nop == knopSub))
            {
                rType = AsmJsType::Int;
            }
        }

        EmitExpressionInfo emitInfo( AsmJsType::Double );
        StartStatement(pnode);
        if( lType.isInt() && rType.isInt() )
        {
            CheckNodeLocation( lhsEmit, int );
            CheckNodeLocation( rhsEmit, int );
            // because fixnum can be either signed or unsigned, use both lhs and rhs to infer sign
            auto opType = (lType.isSigned() && rType.isSigned()) ? BMOT_Int : BMOT_UInt;
            if (op == BMO_REM || op == BMO_DIV)
            {
                // div and rem must have explicit sign
                if (!(lType.isSigned() && rType.isSigned()) && !(lType.isUnsigned() && rType.isUnsigned()))
                {
                    throw AsmJsCompilationException(_u("arguments to / or %% must both be double?, float?, signed, or unsigned; %s and %s given"), lType.toChars(), rType.toChars());
                }
            }

            // try to reuse tmp register
            RegSlot intReg = GetAndReleaseBinaryLocations<int>( &lhsEmit, &rhsEmit );
            mWriter.AsmReg3(BinaryMathOpCodes[op][opType], intReg, lhsEmit.location, rhsEmit.location );
            emitInfo.location = intReg;
            emitInfo.type = AsmJsType::Intish;
        }
        else if (lType.isMaybeDouble() && rType.isMaybeDouble())
        {
            CheckNodeLocation( lhsEmit, double );
            CheckNodeLocation( rhsEmit, double );

            RegSlot dbReg = GetAndReleaseBinaryLocations<double>( &lhsEmit, &rhsEmit );
            mWriter.AsmReg3( BinaryMathOpCodes[op][BMOT_Double], dbReg, lhsEmit.location, rhsEmit.location );
            emitInfo.location = dbReg;
        }
        else if (lType.isMaybeFloat() && rType.isMaybeFloat())
        {
            if (BinaryMathOpCodes[op][BMOT_Float] == OpCodeAsmJs::Nop)
            {
                throw AsmJsCompilationException(_u("invalid Binary float operation"));
            }

            CheckNodeLocation(lhsEmit, float);
            CheckNodeLocation(rhsEmit, float);

            RegSlot floatReg = GetAndReleaseBinaryLocations<float>(&lhsEmit, &rhsEmit);
            mWriter.AsmReg3(BinaryMathOpCodes[op][BMOT_Float], floatReg, lhsEmit.location, rhsEmit.location);
            emitInfo.location = floatReg;
            emitInfo.type = AsmJsType::Floatish;
        }
        else
        {
            throw AsmJsCompilationException( _u("Unsupported math operation") );
        }
        EndStatement(pnode);
        return emitInfo;
    }